

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O2

PubkeyDataStruct *
cfd::js::api::KeyStructApi::GetPubkeyFromPrivkey
          (PubkeyDataStruct *__return_storage_ptr__,GetPubkeyFromPrivkeyRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&)>
  local_f8;
  PubkeyDataStruct local_d8;
  
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:202:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:202:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"GetPubkeyFromPrivkey",&local_119);
  ExecuteStructApi<cfd::js::api::GetPubkeyFromPrivkeyRequestStruct,cfd::js::api::PubkeyDataStruct>
            (&local_d8,(api *)request,(GetPubkeyFromPrivkeyRequestStruct *)&local_118,&local_f8,
             in_R8);
  PubkeyDataStruct::operator=(__return_storage_ptr__,&local_d8);
  PubkeyDataStruct::~PubkeyDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct KeyStructApi::GetPubkeyFromPrivkey(
    const GetPubkeyFromPrivkeyRequestStruct& request) {
  auto call_func = [](const GetPubkeyFromPrivkeyRequestStruct& request)
      -> PubkeyDataStruct {
    PubkeyDataStruct response;

    KeyApi api;
    response.pubkey =
        api.GetPubkeyFromPrivkey(request.privkey, request.is_compressed);
    return response;
  };

  PubkeyDataStruct result;
  result =
      ExecuteStructApi<GetPubkeyFromPrivkeyRequestStruct, PubkeyDataStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}